

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O2

void av1_build_quantizer(aom_bit_depth_t bit_depth,int y_dc_delta_q,int u_dc_delta_q,
                        int u_ac_delta_q,int v_dc_delta_q,int v_ac_delta_q,QUANTS *quants,
                        Dequants *deq,int sharpness)

{
  int iVar1;
  byte bVar2;
  int16_t iVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int qindex;
  uint uVar8;
  int16_t *piVar9;
  int iVar10;
  int16_t (*paiVar11) [8];
  long lVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  int16_t (*local_148) [8];
  int16_t *local_120;
  
  iVar5 = (sharpness * -0x10 + 0x70) / -7 + 0x40;
  piVar9 = quants->v_round[0] + 2;
  local_120 = deq->v_dequant_QTX[0] + 2;
  lVar13 = 0;
  paiVar11 = quants->v_round;
  local_148 = deq->v_dequant_QTX;
  do {
    if (lVar13 == 0x100) {
      return;
    }
    qindex = (int)lVar13;
    iVar3 = av1_dc_quant_QTX(qindex,0,bit_depth);
    if (bit_depth == AOM_BITS_12) {
      bVar15 = SBORROW2(iVar3,0x940);
      bVar14 = (short)(iVar3 + -0x940) < 0;
LAB_00267fd2:
      iVar10 = (uint)(bVar15 != bVar14) * 4 + 0x50;
      if (lVar13 == 0) {
        iVar10 = 0x40;
      }
    }
    else {
      if (bit_depth == AOM_BITS_10) {
        bVar15 = SBORROW2(iVar3,0x250);
        bVar14 = (short)(iVar3 + -0x250) < 0;
        goto LAB_00267fd2;
      }
      iVar10 = -1;
      if (bit_depth == AOM_BITS_8) {
        bVar15 = SBORROW2(iVar3,0x94);
        bVar14 = (short)(iVar3 + -0x94) < 0;
        goto LAB_00267fd2;
      }
    }
    bVar14 = lVar13 != 0;
    iVar6 = (uint)(lVar13 == 0) * 0x10 + 0x30;
    iVar7 = 0x40;
    if (bVar14 && sharpness != 0) {
      iVar7 = iVar5;
    }
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      if (bVar14 && sharpness != 0) {
        iVar6 = iVar5;
      }
      if (lVar12 == 0) {
        sVar4 = av1_dc_quant_QTX(qindex,y_dc_delta_q,bit_depth);
      }
      else {
        sVar4 = av1_ac_quant_QTX(qindex,0,bit_depth);
      }
      uVar8 = (uint)sVar4;
      iVar1 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      ((QUANTS *)(paiVar11 + -0x1100))->y_quant[0][lVar12] =
           (short)((0x10000 << ((byte)iVar1 & 0x1f)) / (int)uVar8) + 1;
      paiVar11[-0x1000][lVar12] = (int16_t)(1 << (0x10 - (byte)iVar1 & 0x1f));
      paiVar11[-0xd00][lVar12] = (int16_t)(0x10000 / (long)(int)uVar8);
      paiVar11[-0xa00][lVar12] = (int16_t)(iVar7 * uVar8 >> 7);
      paiVar11[-0xf00][lVar12] = (int16_t)(iVar10 * uVar8 + 0x40 >> 7);
      paiVar11[-0xe00][lVar12] = (int16_t)(iVar6 * uVar8 >> 7);
      ((Dequants *)(local_148 + -0x200))->y_dequant_QTX[0][lVar12] = sVar4;
      if (lVar12 == 0) {
        sVar4 = av1_dc_quant_QTX(qindex,u_dc_delta_q,bit_depth);
      }
      else {
        sVar4 = av1_ac_quant_QTX(qindex,u_ac_delta_q,bit_depth);
      }
      uVar8 = (uint)sVar4;
      iVar1 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      paiVar11[-0x700][lVar12] = (short)((0x10000 << ((byte)iVar1 & 0x1f)) / (int)uVar8) + 1;
      paiVar11[-0x500][lVar12] = (int16_t)(1 << (0x10 - (byte)iVar1 & 0x1f));
      paiVar11[-0xc00][lVar12] = (int16_t)(0x10000 / (long)(int)uVar8);
      paiVar11[-0x900][lVar12] = (int16_t)(iVar7 * uVar8 >> 7);
      paiVar11[-0x300][lVar12] = (int16_t)(iVar10 * uVar8 + 0x40 >> 7);
      paiVar11[-0x100][lVar12] = (int16_t)(iVar6 * uVar8 >> 7);
      local_148[-0x100][lVar12] = sVar4;
      if (lVar12 == 0) {
        sVar4 = av1_dc_quant_QTX(qindex,v_dc_delta_q,bit_depth);
      }
      else {
        sVar4 = av1_ac_quant_QTX(qindex,v_ac_delta_q,bit_depth);
      }
      uVar8 = (uint)sVar4;
      iVar1 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      paiVar11[-0x600][lVar12] = (short)((0x10000 << ((byte)iVar1 & 0x1f)) / (int)uVar8) + 1;
      bVar2 = 0x10 - (byte)iVar1 & 0x1f;
      paiVar11[-0x400][lVar12] = (int16_t)(1 << bVar2);
      paiVar11[-0xb00][lVar12] =
           (int16_t)((long)((ulong)(uint)(0 << bVar2) << 0x20 | 0x10000) / (long)(int)uVar8);
      paiVar11[-0x800][lVar12] = (int16_t)(iVar7 * uVar8 >> 7);
      paiVar11[-0x200][lVar12] = (int16_t)(iVar10 * uVar8 + 0x40 >> 7);
      (*paiVar11)[lVar12] = (int16_t)(iVar6 * uVar8 >> 7);
      (*local_148)[lVar12] = sVar4;
    }
    for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
      piVar9[lVar12 + -0x8800] = quants->y_quant[lVar13][1];
      piVar9[lVar12 + -0x6800] = quants->y_quant_fp[lVar13][1];
      piVar9[lVar12 + -0x5000] = quants->y_round_fp[lVar13][1];
      piVar9[lVar12 + -0x8000] = quants->y_quant_shift[lVar13][1];
      piVar9[lVar12 + -0x7800] = quants->y_zbin[lVar13][1];
      piVar9[lVar12 + -0x7000] = quants->y_round[lVar13][1];
      local_120[lVar12 + -0x1000] = deq->y_dequant_QTX[lVar13][1];
      piVar9[lVar12 + -0x3800] = quants->u_quant[lVar13][1];
      piVar9[lVar12 + -0x6000] = quants->u_quant_fp[lVar13][1];
      piVar9[lVar12 + -0x4800] = quants->u_round_fp[lVar13][1];
      piVar9[lVar12 + -0x2800] = quants->u_quant_shift[lVar13][1];
      piVar9[lVar12 + -0x1800] = quants->u_zbin[lVar13][1];
      piVar9[lVar12 + -0x800] = quants->u_round[lVar13][1];
      local_120[lVar12 + -0x800] = deq->u_dequant_QTX[lVar13][1];
      piVar9[lVar12 + -0x3000] = quants->v_quant[lVar13][1];
      piVar9[lVar12 + -0x5800] = quants->v_quant_fp[lVar13][1];
      piVar9[lVar12 + -0x4000] = quants->v_round_fp[lVar13][1];
      piVar9[lVar12 + -0x2000] = quants->v_quant_shift[lVar13][1];
      piVar9[lVar12 + -0x1000] = quants->v_zbin[lVar13][1];
      piVar9[lVar12] = quants->v_round[lVar13][1];
      local_120[lVar12] = deq->v_dequant_QTX[lVar13][1];
    }
    lVar13 = lVar13 + 1;
    paiVar11 = paiVar11 + 1;
    local_148 = local_148 + 1;
    piVar9 = piVar9 + 8;
    local_120 = local_120 + 8;
  } while( true );
}

Assistant:

void av1_build_quantizer(aom_bit_depth_t bit_depth, int y_dc_delta_q,
                         int u_dc_delta_q, int u_ac_delta_q, int v_dc_delta_q,
                         int v_ac_delta_q, QUANTS *const quants,
                         Dequants *const deq, int sharpness) {
  int i, q, quant_QTX;
  const int sharpness_adjustment = 16 * (7 - sharpness) / 7;

  for (q = 0; q < QINDEX_RANGE; q++) {
    const int qzbin_factor = get_qzbin_factor(q, bit_depth);
    int qrounding_factor = q == 0 ? 64 : 48;

    for (i = 0; i < 2; ++i) {
      int qrounding_factor_fp = 64;

      if (sharpness != 0 && q != 0) {
        qrounding_factor = 64 - sharpness_adjustment;
        qrounding_factor_fp = 64 - sharpness_adjustment;
      }

      // y quantizer with TX scale
      quant_QTX = i == 0 ? av1_dc_quant_QTX(q, y_dc_delta_q, bit_depth)
                         : av1_ac_quant_QTX(q, 0, bit_depth);
      invert_quant(&quants->y_quant[q][i], &quants->y_quant_shift[q][i],
                   quant_QTX);
      quants->y_quant_fp[q][i] = (1 << 16) / quant_QTX;
      quants->y_round_fp[q][i] = (qrounding_factor_fp * quant_QTX) >> 7;
      quants->y_zbin[q][i] = ROUND_POWER_OF_TWO(qzbin_factor * quant_QTX, 7);
      quants->y_round[q][i] = (qrounding_factor * quant_QTX) >> 7;
      deq->y_dequant_QTX[q][i] = quant_QTX;

      // u quantizer with TX scale
      quant_QTX = i == 0 ? av1_dc_quant_QTX(q, u_dc_delta_q, bit_depth)
                         : av1_ac_quant_QTX(q, u_ac_delta_q, bit_depth);
      invert_quant(&quants->u_quant[q][i], &quants->u_quant_shift[q][i],
                   quant_QTX);
      quants->u_quant_fp[q][i] = (1 << 16) / quant_QTX;
      quants->u_round_fp[q][i] = (qrounding_factor_fp * quant_QTX) >> 7;
      quants->u_zbin[q][i] = ROUND_POWER_OF_TWO(qzbin_factor * quant_QTX, 7);
      quants->u_round[q][i] = (qrounding_factor * quant_QTX) >> 7;
      deq->u_dequant_QTX[q][i] = quant_QTX;

      // v quantizer with TX scale
      quant_QTX = i == 0 ? av1_dc_quant_QTX(q, v_dc_delta_q, bit_depth)
                         : av1_ac_quant_QTX(q, v_ac_delta_q, bit_depth);
      invert_quant(&quants->v_quant[q][i], &quants->v_quant_shift[q][i],
                   quant_QTX);
      quants->v_quant_fp[q][i] = (1 << 16) / quant_QTX;
      quants->v_round_fp[q][i] = (qrounding_factor_fp * quant_QTX) >> 7;
      quants->v_zbin[q][i] = ROUND_POWER_OF_TWO(qzbin_factor * quant_QTX, 7);
      quants->v_round[q][i] = (qrounding_factor * quant_QTX) >> 7;
      deq->v_dequant_QTX[q][i] = quant_QTX;
    }

    for (i = 2; i < 8; i++) {  // 8: SIMD width
      quants->y_quant[q][i] = quants->y_quant[q][1];
      quants->y_quant_fp[q][i] = quants->y_quant_fp[q][1];
      quants->y_round_fp[q][i] = quants->y_round_fp[q][1];
      quants->y_quant_shift[q][i] = quants->y_quant_shift[q][1];
      quants->y_zbin[q][i] = quants->y_zbin[q][1];
      quants->y_round[q][i] = quants->y_round[q][1];
      deq->y_dequant_QTX[q][i] = deq->y_dequant_QTX[q][1];

      quants->u_quant[q][i] = quants->u_quant[q][1];
      quants->u_quant_fp[q][i] = quants->u_quant_fp[q][1];
      quants->u_round_fp[q][i] = quants->u_round_fp[q][1];
      quants->u_quant_shift[q][i] = quants->u_quant_shift[q][1];
      quants->u_zbin[q][i] = quants->u_zbin[q][1];
      quants->u_round[q][i] = quants->u_round[q][1];
      deq->u_dequant_QTX[q][i] = deq->u_dequant_QTX[q][1];

      quants->v_quant[q][i] = quants->v_quant[q][1];
      quants->v_quant_fp[q][i] = quants->v_quant_fp[q][1];
      quants->v_round_fp[q][i] = quants->v_round_fp[q][1];
      quants->v_quant_shift[q][i] = quants->v_quant_shift[q][1];
      quants->v_zbin[q][i] = quants->v_zbin[q][1];
      quants->v_round[q][i] = quants->v_round[q][1];
      deq->v_dequant_QTX[q][i] = deq->v_dequant_QTX[q][1];
    }
  }
}